

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferMemoryAliasing.cpp
# Opt level: O3

void vkt::sparse::addBufferSparseMemoryAliasingTests(TestCaseGroup *group)

{
  TestContext *pTVar1;
  TestNode *pTVar2;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  pTVar2 = (TestNode *)operator_new(0x78);
  pTVar1 = (group->super_TestNode).m_testCtx;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"buffer_size_2_10","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  tcu::TestCase::TestCase((TestCase *)pTVar2,pTVar1,(char *)local_70[0],(char *)local_50[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d350a0;
  pTVar2[1]._vptr_TestNode = (_func_int **)0xc00000400;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar2);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  pTVar2 = (TestNode *)operator_new(0x78);
  pTVar1 = (group->super_TestNode).m_testCtx;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"buffer_size_2_12","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  tcu::TestCase::TestCase((TestCase *)pTVar2,pTVar1,(char *)local_70[0],(char *)local_50[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d350a0;
  pTVar2[1]._vptr_TestNode = (_func_int **)0xc00001000;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar2);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  pTVar2 = (TestNode *)operator_new(0x78);
  pTVar1 = (group->super_TestNode).m_testCtx;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"buffer_size_2_16","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  tcu::TestCase::TestCase((TestCase *)pTVar2,pTVar1,(char *)local_70[0],(char *)local_50[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d350a0;
  pTVar2[1]._vptr_TestNode = (_func_int **)0xc00010000;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar2);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  pTVar2 = (TestNode *)operator_new(0x78);
  pTVar1 = (group->super_TestNode).m_testCtx;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"buffer_size_2_17","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  tcu::TestCase::TestCase((TestCase *)pTVar2,pTVar1,(char *)local_70[0],(char *)local_50[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d350a0;
  pTVar2[1]._vptr_TestNode = (_func_int **)0xc00020000;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar2);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  pTVar2 = (TestNode *)operator_new(0x78);
  pTVar1 = (group->super_TestNode).m_testCtx;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"buffer_size_2_20","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  tcu::TestCase::TestCase((TestCase *)pTVar2,pTVar1,(char *)local_70[0],(char *)local_50[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d350a0;
  pTVar2[1]._vptr_TestNode = (_func_int **)0xc00100000;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar2);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  pTVar2 = (TestNode *)operator_new(0x78);
  pTVar1 = (group->super_TestNode).m_testCtx;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"buffer_size_2_24","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  tcu::TestCase::TestCase((TestCase *)pTVar2,pTVar1,(char *)local_70[0],(char *)local_50[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d350a0;
  pTVar2[1]._vptr_TestNode = (_func_int **)0xc01000000;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar2);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return;
}

Assistant:

void addBufferSparseMemoryAliasingTests(tcu::TestCaseGroup* group)
{
	group->addChild(new BufferSparseMemoryAliasingCase(group->getTestContext(), "buffer_size_2_10", "", 1 << 10, glu::GLSL_VERSION_440));
	group->addChild(new BufferSparseMemoryAliasingCase(group->getTestContext(), "buffer_size_2_12", "", 1 << 12, glu::GLSL_VERSION_440));
	group->addChild(new BufferSparseMemoryAliasingCase(group->getTestContext(), "buffer_size_2_16", "", 1 << 16, glu::GLSL_VERSION_440));
	group->addChild(new BufferSparseMemoryAliasingCase(group->getTestContext(), "buffer_size_2_17", "", 1 << 17, glu::GLSL_VERSION_440));
	group->addChild(new BufferSparseMemoryAliasingCase(group->getTestContext(), "buffer_size_2_20", "", 1 << 20, glu::GLSL_VERSION_440));
	group->addChild(new BufferSparseMemoryAliasingCase(group->getTestContext(), "buffer_size_2_24", "", 1 << 24, glu::GLSL_VERSION_440));
}